

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSimpleDynamicsWorld.cpp
# Opt level: O0

void __thiscall
btSimpleDynamicsWorld::predictUnconstraintMotion(btSimpleDynamicsWorld *this,btScalar timeStep)

{
  bool bVar1;
  int iVar2;
  btRigidBody *this_00;
  long in_RDI;
  undefined4 in_XMM0_Da;
  btScalar in_stack_0000000c;
  btRigidBody *in_stack_00000010;
  btRigidBody *body;
  btCollisionObject *colObj;
  int i;
  btScalar in_stack_0000003c;
  btRigidBody *in_stack_00000040;
  btRigidBody *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  int iVar3;
  int local_10;
  
  local_10 = 0;
  while (iVar3 = local_10,
        iVar2 = btAlignedObjectArray<btCollisionObject_*>::size
                          ((btAlignedObjectArray<btCollisionObject_*> *)(in_RDI + 8)), iVar3 < iVar2
        ) {
    btAlignedObjectArray<btCollisionObject_*>::operator[]
              ((btAlignedObjectArray<btCollisionObject_*> *)(in_RDI + 8),local_10);
    this_00 = btRigidBody::upcast(&in_stack_ffffffffffffffc8->super_btCollisionObject);
    if (((this_00 != (btRigidBody *)0x0) &&
        (bVar1 = btCollisionObject::isStaticObject(&this_00->super_btCollisionObject), !bVar1)) &&
       (bVar1 = btCollisionObject::isActive
                          ((btCollisionObject *)CONCAT44(iVar3,in_stack_ffffffffffffffd0)), bVar1))
    {
      btRigidBody::applyGravity((btRigidBody *)CONCAT44(iVar3,in_stack_ffffffffffffffd0));
      btRigidBody::integrateVelocities(in_stack_00000010,in_stack_0000000c);
      btRigidBody::applyDamping(in_stack_00000040,in_stack_0000003c);
      in_stack_ffffffffffffffd0 = in_XMM0_Da;
      btCollisionObject::getInterpolationWorldTransform(&this_00->super_btCollisionObject);
      btRigidBody::predictIntegratedTransform
                ((btRigidBody *)CONCAT44(iVar3,in_stack_ffffffffffffffd0),
                 (btScalar)((ulong)this_00 >> 0x20),(btTransform *)0x232e8f);
      in_stack_ffffffffffffffc8 = this_00;
    }
    local_10 = local_10 + 1;
  }
  return;
}

Assistant:

void	btSimpleDynamicsWorld::predictUnconstraintMotion(btScalar timeStep)
{
	for ( int i=0;i<m_collisionObjects.size();i++)
	{
		btCollisionObject* colObj = m_collisionObjects[i];
		btRigidBody* body = btRigidBody::upcast(colObj);
		if (body)
		{
			if (!body->isStaticObject())
			{
				if (body->isActive())
				{
					body->applyGravity();
					body->integrateVelocities( timeStep);
					body->applyDamping(timeStep);
					body->predictIntegratedTransform(timeStep,body->getInterpolationWorldTransform());
				}
			}
		}
	}
}